

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

void __thiscall
tchecker::parsing::edge_declaration_t::edge_declaration_t
          (edge_declaration_t *this,
          shared_ptr<const_tchecker::parsing::process_declaration_t> *process,
          shared_ptr<const_tchecker::parsing::location_declaration_t> *src,
          shared_ptr<const_tchecker::parsing::location_declaration_t> *tgt,
          shared_ptr<const_tchecker::parsing::event_declaration_t> *event,attributes_t *attr,
          string *context)

{
  bool bVar1;
  invalid_argument *this_00;
  
  inner_declaration_t::declaration_t(&this->super_inner_declaration_t,attr,context);
  (this->super_inner_declaration_t).super_declaration_t._vptr_declaration_t =
       (_func_int **)&PTR__edge_declaration_t_0028ff08;
  std::__shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->_process).
                super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
               ,&process->
                 super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->_src).
                super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
               ,&src->
                 super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->_tgt).
                super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
               ,&tgt->
                 super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->_event).
                super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
               ,&event->
                 super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              );
  bVar1 = std::operator!=(&((((this->_src).
                              super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_process).
                            super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name,
                          &((this->_process).
                            super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_name);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"error, edge declaration has source location that does not belong to process"
              );
  }
  else {
    bVar1 = std::operator!=(&((((this->_tgt).
                                super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_process).
                              super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name,
                            &((this->_process).
                              super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name);
    if (!bVar1) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"error, edge declaration has target location does not belong to process");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

edge_declaration_t::edge_declaration_t(std::shared_ptr<tchecker::parsing::process_declaration_t const> const & process,
                                       std::shared_ptr<tchecker::parsing::location_declaration_t const> const & src,
                                       std::shared_ptr<tchecker::parsing::location_declaration_t const> const & tgt,
                                       std::shared_ptr<tchecker::parsing::event_declaration_t const> const & event,
                                       tchecker::parsing::attributes_t const & attr, std::string const & context)
    : tchecker::parsing::inner_declaration_t(attr, context), _process(process), _src(src), _tgt(tgt), _event(event)
{
  if (_src->process().name() != _process->name())
    throw std::invalid_argument("error, edge declaration has source location that does not belong to process");

  if (_tgt->process().name() != _process->name())
    throw std::invalid_argument("error, edge declaration has target location does not belong to process");
}